

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O0

void jpgd::jpeg_decoder::decode_block_ac_first
               (jpeg_decoder *pD,int component_id,int block_x,int block_y)

{
  uint uVar1;
  int num_bits;
  uint uVar2;
  jpgd_block_coeff_t *pjVar3;
  uint local_38;
  uint idx;
  jpgd_block_coeff_t *p;
  int r;
  int s;
  int k;
  int block_y_local;
  int block_x_local;
  int component_id_local;
  jpeg_decoder *pD_local;
  
  if (pD->m_eob_run == 0) {
    pjVar3 = coeff_buf_getp(pD,pD->m_ac_coeffs[component_id],block_x,block_y);
    for (r = pD->m_spectral_start; r <= pD->m_spectral_end; r = r + 1) {
      if (7 < (uint)pD->m_comp_ac_tab[component_id]) {
        stop_decoding(pD,JPGD_DECODE_ERROR);
      }
      uVar1 = huff_decode(pD,pD->m_pHuff_tabs[(uint)pD->m_comp_ac_tab[component_id]]);
      num_bits = (int)uVar1 >> 4;
      uVar1 = uVar1 & 0xf;
      if (uVar1 == 0) {
        if (num_bits != 0xf) {
          pD->m_eob_run = 1 << ((byte)num_bits & 0x1f);
          if (num_bits != 0) {
            uVar2 = get_bits_no_markers(pD,num_bits);
            pD->m_eob_run = uVar2 + pD->m_eob_run;
          }
          pD->m_eob_run = pD->m_eob_run + -1;
          return;
        }
        r = r + 0xf;
        if (0x3f < r) {
          stop_decoding(pD,JPGD_DECODE_ERROR);
        }
      }
      else {
        r = num_bits + r;
        if (0x3f < r) {
          stop_decoding(pD,JPGD_DECODE_ERROR);
        }
        local_38 = get_bits_no_markers(pD,uVar1);
        if ((int)local_38 < *(int *)(s_extend_test + (long)(int)uVar1 * 4)) {
          local_38 = local_38 + *(int *)(s_extend_offset + (long)(int)uVar1 * 4);
        }
        pjVar3[*(int *)(g_ZAG + (long)r * 4)] =
             (jpgd_block_coeff_t)(local_38 << ((byte)pD->m_successive_low & 0x1f));
      }
    }
  }
  else {
    pD->m_eob_run = pD->m_eob_run + -1;
  }
  return;
}

Assistant:

void jpeg_decoder::decode_block_ac_first(jpeg_decoder* pD, int component_id, int block_x, int block_y)
	{
		int k, s, r;

		if (pD->m_eob_run)
		{
			pD->m_eob_run--;
			return;
		}

		jpgd_block_coeff_t* p = pD->coeff_buf_getp(pD->m_ac_coeffs[component_id], block_x, block_y);

		for (k = pD->m_spectral_start; k <= pD->m_spectral_end; k++)
		{
			unsigned int idx = pD->m_comp_ac_tab[component_id];
			if (idx >= JPGD_MAX_HUFF_TABLES)
				pD->stop_decoding(JPGD_DECODE_ERROR);

			s = pD->huff_decode(pD->m_pHuff_tabs[idx]);

			r = s >> 4;
			s &= 15;

			if (s)
			{
				if ((k += r) > 63)
					pD->stop_decoding(JPGD_DECODE_ERROR);

				r = pD->get_bits_no_markers(s);
				s = JPGD_HUFF_EXTEND(r, s);

				p[g_ZAG[k]] = static_cast<jpgd_block_coeff_t>(s << pD->m_successive_low);
			}
			else
			{
				if (r == 15)
				{
					if ((k += 15) > 63)
						pD->stop_decoding(JPGD_DECODE_ERROR);
				}
				else
				{
					pD->m_eob_run = 1 << r;

					if (r)
						pD->m_eob_run += pD->get_bits_no_markers(r);

					pD->m_eob_run--;

					break;
				}
			}
		}
	}